

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O3

PaError GropeDevice(snd_pcm_t *pcm,int isPlug,StreamDirection mode,int openBlocking,
                   PaAlsaDeviceInfo *devInfo)

{
  snd_pcm_uframes_t sVar1;
  int iVar2;
  size_t __n;
  long lVar3;
  long lVar4;
  undefined4 in_register_0000000c;
  snd_pcm_hw_params_t *hwParams;
  PaError PVar5;
  ulong uVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined8 uStack_70;
  long local_68;
  long local_60;
  int local_58;
  undefined4 local_54;
  ulong uStack_50;
  uint minChans;
  snd_pcm_uframes_t alsaBufferFrames;
  uint local_3c;
  ulong uStack_38;
  uint maxChans;
  snd_pcm_uframes_t alsaPeriodFrames;
  
  local_60 = CONCAT44(in_register_0000000c,openBlocking);
  hwParams = (snd_pcm_hw_params_t *)&local_68;
  if (pcm == (snd_pcm_t *)0x0) {
    uStack_70 = 0x114e39;
    __assert_fail("pcm",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                  ,0x36a,
                  "PaError GropeDevice(snd_pcm_t *, int, StreamDirection, int, PaAlsaDeviceInfo *)")
    ;
  }
  alsaBufferFrames = *(snd_pcm_uframes_t *)(local_60 + 0x40);
  uStack_70 = 0x114b11;
  iVar2 = snd_pcm_nonblock();
  if (iVar2 < 0) {
    uStack_70 = 0x114da9;
    GropeDevice_cold_10();
  }
  else {
    uStack_70 = 0x114b22;
    local_58 = isPlug;
    __n = snd_pcm_hw_params_sizeof();
    lVar4 = -(__n + 0xf & 0xfffffffffffffff0);
    hwParams = (snd_pcm_hw_params_t *)((long)&local_68 + lVar4);
    *(undefined8 *)((long)&uStack_70 + lVar4) = 0x114b40;
    memset(hwParams,0,__n);
    *(undefined8 *)((long)&uStack_70 + lVar4) = 0x114b4b;
    snd_pcm_hw_params_any(pcm,hwParams);
    sVar1 = alsaBufferFrames;
    if ((double)alsaBufferFrames < 0.0) {
LAB_00114b72:
      if ((double)alsaBufferFrames < 0.0) goto LAB_00114b85;
LAB_00114bee:
      *(undefined8 *)((long)&uStack_70 + lVar4) = 0x114bff;
      iVar2 = snd_pcm_hw_params_get_channels_min(hwParams,&local_54);
      if (iVar2 < 0) {
        *(undefined8 *)((long)&uStack_70 + lVar4) = 0x114db2;
        GropeDevice_cold_8();
      }
      else {
        *(undefined8 *)((long)&uStack_70 + lVar4) = 0x114c13;
        iVar2 = snd_pcm_hw_params_get_channels_max(hwParams,&local_3c);
        if (iVar2 < 0) {
          *(undefined8 *)((long)&uStack_70 + lVar4) = 0x114dbb;
          GropeDevice_cold_7();
        }
        else {
          uVar6 = (ulong)((uint)(mode != StreamDirection_In) * 4);
          local_68 = uVar6 + 100;
          uVar7 = (ulong)(mode != StreamDirection_In) * 8;
          if ((int)local_3c < 0) {
            *(undefined8 *)((long)&uStack_70 + lVar4) = 0x114e58;
            __assert_fail("maxChans <= INT_MAX",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                          ,0x39e,
                          "PaError GropeDevice(snd_pcm_t *, int, StreamDirection, int, PaAlsaDeviceInfo *)"
                         );
          }
          if (local_3c == 0) {
            *(undefined8 *)((long)&uStack_70 + lVar4) = 0x114e77;
            __assert_fail("maxChans > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                          ,0x39f,
                          "PaError GropeDevice(snd_pcm_t *, int, StreamDirection, int, PaAlsaDeviceInfo *)"
                         );
          }
          if (0x80 < local_3c && local_58 != 0) {
            local_3c = 0x80;
          }
          uStack_50 = 0x200;
          uStack_38 = 0x80;
          *(undefined8 *)((long)&uStack_70 + lVar4) = 0x114c87;
          iVar2 = snd_pcm_hw_params_set_buffer_size_near(pcm,hwParams);
          if (iVar2 < 0) {
            *(undefined8 *)((long)&uStack_70 + lVar4) = 0x114dc4;
            GropeDevice_cold_6();
          }
          else {
            *(undefined8 *)((long)&uStack_70 + lVar4) = 0x114ca0;
            iVar2 = snd_pcm_hw_params_set_period_size_near(pcm,hwParams,&stack0xffffffffffffffc8,0);
            if (iVar2 < 0) {
              *(undefined8 *)((long)&uStack_70 + lVar4) = 0x114dcd;
              GropeDevice_cold_5();
            }
            else {
              lVar3 = uStack_50 - uStack_38;
              auVar8._8_4_ = (int)((ulong)lVar3 >> 0x20);
              auVar8._0_8_ = lVar3;
              auVar8._12_4_ = 0x45300000;
              *(double *)(local_60 + uVar7 + 0x20) =
                   ((auVar8._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) /
                   (double)alsaBufferFrames;
              uStack_50 = 0x800;
              uStack_38 = 0x200;
              *(undefined8 *)((long)&uStack_70 + lVar4) = 0x114cfb;
              iVar2 = snd_pcm_hw_params_any(pcm,hwParams);
              sVar1 = alsaBufferFrames;
              if (iVar2 < 0) {
                *(undefined8 *)((long)&uStack_70 + lVar4) = 0x114dd6;
                GropeDevice_cold_4();
              }
              else {
                *(undefined8 *)((long)&uStack_70 + lVar4) = 0x114d13;
                iVar2 = SetApproximateSampleRate(pcm,hwParams,(double)sVar1);
                if (iVar2 < 0) {
                  *(undefined8 *)((long)&uStack_70 + lVar4) = 0x114ddf;
                  GropeDevice_cold_3();
                }
                else {
                  *(undefined8 *)((long)&uStack_70 + lVar4) = 0x114d2a;
                  iVar2 = snd_pcm_hw_params_set_buffer_size_near
                                    (pcm,hwParams,&stack0xffffffffffffffb0);
                  if (iVar2 < 0) {
                    *(undefined8 *)((long)&uStack_70 + lVar4) = 0x114de8;
                    GropeDevice_cold_2();
                  }
                  else {
                    PVar5 = 0;
                    *(undefined8 *)((long)&uStack_70 + lVar4) = 0x114d46;
                    iVar2 = snd_pcm_hw_params_set_period_size_near
                                      (pcm,hwParams,&stack0xffffffffffffffc8,0);
                    if (-1 < iVar2) {
                      lVar4 = uStack_50 - uStack_38;
                      auVar9._8_4_ = (int)((ulong)lVar4 >> 0x20);
                      auVar9._0_8_ = lVar4;
                      auVar9._12_4_ = 0x45300000;
                      *(double *)(local_60 + (uVar7 | 0x30)) =
                           ((auVar9._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) /
                           (double)alsaBufferFrames;
                      *(undefined4 *)(local_60 + local_68) = local_54;
                      *(uint *)(local_60 + uVar6 + 0x14) = local_3c;
                      *(snd_pcm_uframes_t *)(local_60 + 0x40) = alsaBufferFrames;
                      goto LAB_00114e00;
                    }
                    *(undefined8 *)((long)&uStack_70 + lVar4) = 0x114df1;
                    GropeDevice_cold_1();
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      *(undefined8 *)((long)&uStack_70 + lVar4) = 0x114b65;
      iVar2 = SetApproximateSampleRate(pcm,hwParams,(double)sVar1);
      if (-1 < iVar2) goto LAB_00114b72;
      *(undefined8 *)((long)&uStack_70 + lVar4) = 0x114b85;
      snd_pcm_hw_params_any(pcm,hwParams);
LAB_00114b85:
      local_54 = 0xac44;
      *(undefined8 *)((long)&uStack_70 + lVar4) = 0x114b9e;
      snd_pcm_hw_params_set_rate_resample(pcm,hwParams,0);
      *(undefined8 *)((long)&uStack_70 + lVar4) = 0x114bae;
      iVar2 = snd_pcm_hw_params_set_rate_near(pcm,hwParams,&local_54,0);
      if (-1 < iVar2) {
        uStack_38 = CONCAT44(maxChans,1);
        *(undefined8 *)((long)&uStack_70 + lVar4) = 0x114bcc;
        iVar2 = snd_pcm_hw_params_get_rate_numden(hwParams,&stack0xffffffffffffffb0);
        if (-1 < iVar2) {
          alsaBufferFrames =
               (snd_pcm_uframes_t)
               ((double)(uStack_50 & 0xffffffff) / (double)(uStack_38 & 0xffffffff));
          goto LAB_00114bee;
        }
        *(undefined8 *)((long)&uStack_70 + lVar4) = 0x114dfa;
        GropeDevice_cold_9();
      }
    }
  }
  PVar5 = -9999;
LAB_00114e00:
  *(undefined8 *)(hwParams + -8) = 0x114e08;
  snd_pcm_close(pcm);
  return PVar5;
}

Assistant:

static PaError GropeDevice( snd_pcm_t* pcm, int isPlug, StreamDirection mode, int openBlocking,
        PaAlsaDeviceInfo* devInfo )
{
    PaError result = paNoError;
    snd_pcm_hw_params_t *hwParams;
    snd_pcm_uframes_t alsaBufferFrames, alsaPeriodFrames;
    unsigned int minChans, maxChans;
    int* minChannels, * maxChannels;
    double * defaultLowLatency, * defaultHighLatency, * defaultSampleRate =
        &devInfo->baseDeviceInfo.defaultSampleRate;
    double defaultSr = *defaultSampleRate;

    assert( pcm );

    PA_DEBUG(( "%s: collecting info ..\n", __FUNCTION__ ));

    if( StreamDirection_In == mode )
    {
        minChannels = &devInfo->minInputChannels;
        maxChannels = &devInfo->baseDeviceInfo.maxInputChannels;
        defaultLowLatency = &devInfo->baseDeviceInfo.defaultLowInputLatency;
        defaultHighLatency = &devInfo->baseDeviceInfo.defaultHighInputLatency;
    }
    else
    {
        minChannels = &devInfo->minOutputChannels;
        maxChannels = &devInfo->baseDeviceInfo.maxOutputChannels;
        defaultLowLatency = &devInfo->baseDeviceInfo.defaultLowOutputLatency;
        defaultHighLatency = &devInfo->baseDeviceInfo.defaultHighOutputLatency;
    }

    ENSURE_( alsa_snd_pcm_nonblock( pcm, 0 ), paUnanticipatedHostError );

    alsa_snd_pcm_hw_params_alloca( &hwParams );
    alsa_snd_pcm_hw_params_any( pcm, hwParams );

    if( defaultSr >= 0 )
    {
        /* Could be that the device opened in one mode supports samplerates that the other mode wont have,
         * so try again .. */
        if( SetApproximateSampleRate( pcm, hwParams, defaultSr ) < 0 )
        {
            defaultSr = -1.;
            alsa_snd_pcm_hw_params_any( pcm, hwParams ); /* Clear any params (rate) that might have been set */
            PA_DEBUG(( "%s: Original default samplerate failed, trying again ..\n", __FUNCTION__ ));
        }
    }

    if( defaultSr < 0. )           /* Default sample rate not set */
    {
        unsigned int sampleRate = 44100;        /* Will contain approximate rate returned by alsa-lib */

        /* Don't allow rate resampling when probing for the default rate (but ignore if this call fails) */
        alsa_snd_pcm_hw_params_set_rate_resample( pcm, hwParams, 0 );
        if( alsa_snd_pcm_hw_params_set_rate_near( pcm, hwParams, &sampleRate, NULL ) < 0 )
        {
            result = paUnanticipatedHostError;
            goto error;
        }
        ENSURE_( GetExactSampleRate( hwParams, &defaultSr ), paUnanticipatedHostError );
    }

    ENSURE_( alsa_snd_pcm_hw_params_get_channels_min( hwParams, &minChans ), paUnanticipatedHostError );
    ENSURE_( alsa_snd_pcm_hw_params_get_channels_max( hwParams, &maxChans ), paUnanticipatedHostError );
    assert( maxChans <= INT_MAX );
    assert( maxChans > 0 );    /* Weird linking issue could cause wrong version of ALSA symbols to be called,
                                   resulting in zeroed values */

    /* XXX: Limit to sensible number (ALSA plugins accept a crazy amount of channels)? */
    if( isPlug && maxChans > 128 )
    {
        maxChans = 128;
        PA_DEBUG(( "%s: Limiting number of plugin channels to %u\n", __FUNCTION__, maxChans ));
    }

    /* TWEAKME:
     * Giving values for default min and max latency is not straightforward.
     *  * for low latency, we want to give the lowest value that will work reliably.
     *      This varies based on the sound card, kernel, CPU, etc.  Better to give
     *      sub-optimal latency than to give a number too low and cause dropouts.
     *  * for high latency we want to give a large enough value that dropouts are basically impossible.
     *      This doesn't really require as much tweaking, since providing too large a number will
     *      just cause us to select the nearest setting that will work at stream config time.
     */
    /* Try low latency values, (sometimes the buffer & period that result are larger) */
    alsaBufferFrames = 512;
    alsaPeriodFrames = 128;
    ENSURE_( alsa_snd_pcm_hw_params_set_buffer_size_near( pcm, hwParams, &alsaBufferFrames ), paUnanticipatedHostError );
    ENSURE_( alsa_snd_pcm_hw_params_set_period_size_near( pcm, hwParams, &alsaPeriodFrames, NULL ), paUnanticipatedHostError );
    *defaultLowLatency = (double) (alsaBufferFrames - alsaPeriodFrames) / defaultSr;

    /* Base the high latency case on values four times larger */
    alsaBufferFrames = 2048;
    alsaPeriodFrames = 512;
    /* Have to reset hwParams, to set new buffer size; need to also set sample rate again */
    ENSURE_( alsa_snd_pcm_hw_params_any( pcm, hwParams ), paUnanticipatedHostError );
    ENSURE_( SetApproximateSampleRate( pcm, hwParams, defaultSr ), paUnanticipatedHostError );
    ENSURE_( alsa_snd_pcm_hw_params_set_buffer_size_near( pcm, hwParams, &alsaBufferFrames ), paUnanticipatedHostError );
    ENSURE_( alsa_snd_pcm_hw_params_set_period_size_near( pcm, hwParams, &alsaPeriodFrames, NULL ), paUnanticipatedHostError );
    *defaultHighLatency = (double) (alsaBufferFrames - alsaPeriodFrames) / defaultSr;

    *minChannels = (int)minChans;
    *maxChannels = (int)maxChans;
    *defaultSampleRate = defaultSr;

end:
    alsa_snd_pcm_close( pcm );
    return result;

error:
    goto end;
}